

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall
cfd::TransactionContext::SignWithKey
          (TransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,bool has_grind_r,ByteData256 *aux_rand,ByteData *annex)

{
  bool bVar1;
  char cVar2;
  CfdException *this_00;
  SigHashType local_564 [12];
  Script local_558;
  UtxoData utxo;
  
  UtxoData::UtxoData(&utxo);
  bVar1 = IsFindUtxoMap(this,outpoint,&utxo);
  if (bVar1) {
    GetLockingScriptFromUtxoData(&local_558,&utxo);
    cfd::core::Script::operator=(&utxo.locking_script,&local_558);
    core::Script::~Script(&local_558);
    cVar2 = cfd::core::Script::IsTaprootScript();
    if (cVar2 == '\0') {
      cfd::core::SigHashType::SigHashType(local_564,sighash_type);
      SignWithPrivkeySimple
                (this,outpoint,pubkey,privkey,local_564,&utxo.amount,utxo.address_type,has_grind_r);
    }
    else {
      SignWithSchnorrPrivkeySimple(this,outpoint,privkey,sighash_type,aux_rand,annex);
    }
    UtxoData::~UtxoData(&utxo);
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_558._vptr_Script =
       (_func_int **)
       ((long)&local_558.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_558,"Utxo is not found. sign fail.","");
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_558);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::SignWithKey(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, bool has_grind_r, const ByteData256* aux_rand,
    const ByteData* annex) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. sign fail.");
  }
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    SignWithSchnorrPrivkeySimple(
        outpoint, privkey, sighash_type, aux_rand, annex);
  } else {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.amount,
        utxo.address_type, has_grind_r);
  }
}